

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_text.c
# Opt level: O1

void qlist_donext(t_qlist *x,int drop,int automatic)

{
  t_atomtype tVar1;
  t_atomtype *ptVar2;
  int iVar3;
  t_atom *ptVar4;
  t_atom *argv;
  int iVar5;
  int iVar6;
  t_symbol *s;
  t_atom *ptVar7;
  _class **x_00;
  int iVar8;
  float fVar9;
  double dVar10;
  
  if (x->x_innext != 0) {
    pd_error(x,"qlist sent \'next\' from within itself");
    return;
  }
  x->x_innext = 1;
  x_00 = (_class **)0x0;
LAB_0018fabb:
  iVar3 = binbuf_getnatom((x->x_textbuf).b_binbuf);
  iVar8 = x->x_onset;
  ptVar4 = binbuf_getvec((x->x_textbuf).b_binbuf);
  iVar5 = 4;
  if (iVar8 < iVar3) {
    argv = ptVar4 + iVar8;
    ptVar4 = ptVar4 + iVar8;
LAB_0018faf4:
    ptVar4 = ptVar4 + 1;
    tVar1 = argv->a_type;
    if ((tVar1 & ~A_FLOAT) == A_SEMI) goto code_r0x0018fb00;
    if (tVar1 != A_FLOAT || x_00 != (_class **)0x0) {
      iVar5 = iVar8 + 1;
      ptVar4 = argv + 1;
      iVar6 = iVar5;
      for (ptVar7 = ptVar4; (iVar5 < iVar3 && (iVar6 = iVar5, ptVar7->a_type - A_FLOAT < 2));
          ptVar7 = ptVar7 + 1) {
        iVar5 = iVar5 + 1;
        iVar6 = iVar3;
      }
      x->x_onset = iVar6;
      if (x_00 == (_class **)0x0) {
        iVar5 = 2;
        if (tVar1 == A_SYMBOL) {
          x_00 = ((argv->a_w).w_symbol)->s_thing;
          if (x_00 != (_class **)0x0) {
            iVar8 = (iVar6 + -1) - iVar8;
            if (iVar8 != 0) goto LAB_0018fbb8;
            x->x_onset = iVar6;
            goto LAB_0018fc51;
          }
          pd_error(x,"qlist: %s: no such object",((argv->a_w).w_symbol)->s_name);
        }
        goto LAB_0018fbfa;
      }
      iVar8 = iVar6 - iVar8;
      ptVar4 = argv;
LAB_0018fbb8:
      iVar3 = x->x_rewound;
      x->x_rewound = 0;
      if (drop == 0) {
        if (ptVar4->a_type == A_SYMBOL) {
          s = (ptVar4->a_w).w_symbol;
          iVar8 = iVar8 + -1;
          ptVar4 = ptVar4 + 1;
        }
        else {
          if (ptVar4->a_type != A_FLOAT) goto LAB_0018fc35;
          s = &s_list;
        }
        pd_typedmess(x_00,s,iVar8,ptVar4);
      }
LAB_0018fc35:
      if (x->x_rewound == 0) {
        x->x_rewound = iVar3;
        iVar5 = 0;
      }
      else {
        x->x_innext = 0;
        iVar5 = 1;
      }
      goto LAB_0018fc51;
    }
    iVar5 = 1;
    goto LAB_0018fb34;
  }
  goto LAB_0018fc51;
  while( true ) {
    ptVar2 = &ptVar4->a_type;
    ptVar4 = ptVar4 + 1;
    iVar5 = iVar6 + 1;
    if (*ptVar2 != A_FLOAT) break;
LAB_0018fb34:
    iVar6 = iVar5;
    if (iVar3 <= iVar8 + iVar6) break;
  }
  x->x_onset = iVar8 + iVar6;
  if (automatic == 0) {
    outlet_list((x->x_textbuf).b_ob.te_outlet,(t_symbol *)0x0,iVar6,argv);
  }
  else {
    fVar9 = (argv->a_w).w_float * x->x_tempo;
    x->x_clockdelay = fVar9;
    clock_delay(x->x_clock,(double)fVar9);
    dVar10 = clock_getsystime();
    x->x_whenclockset = dVar10;
  }
  x->x_innext = 0;
  iVar5 = 1;
LAB_0018fbfa:
  x_00 = (_class **)0x0;
LAB_0018fc51:
  if ((iVar5 != 0) && (iVar5 != 2)) {
    if (iVar5 == 4) {
      x->x_onset = 0x7fffffff;
      x->x_whenclockset = 0.0;
      x->x_innext = 0;
      outlet_bang(x->x_bangout);
      return;
    }
    return;
  }
  goto LAB_0018fabb;
code_r0x0018fb00:
  if (tVar1 == A_SEMI) {
    x_00 = (_class **)0x0;
  }
  iVar8 = iVar8 + 1;
  argv = argv + 1;
  if (iVar3 == iVar8) goto LAB_0018fc51;
  goto LAB_0018faf4;
}

Assistant:

static void qlist_donext(t_qlist *x, int drop, int automatic)
{
    t_pd *target = 0;
    if (x->x_innext)
    {
        pd_error(x, "qlist sent 'next' from within itself");
        return;
    }
    x->x_innext = 1;
    while (1)
    {
        int argc = binbuf_getnatom(x->x_binbuf),
            count, onset = x->x_onset, onset2, wasrewound;
        t_atom *argv = binbuf_getvec(x->x_binbuf);
        t_atom *ap = argv + onset, *ap2;
        if (onset >= argc) goto end;
        while (ap->a_type == A_SEMI || ap->a_type == A_COMMA)
        {
            if (ap->a_type == A_SEMI) target = 0;
            onset++, ap++;
            if (onset >= argc) goto end;
        }

        if (!target && ap->a_type == A_FLOAT)
        {
            ap2 = ap + 1;
            onset2 = onset + 1;
            while (onset2 < argc && ap2->a_type == A_FLOAT)
                onset2++, ap2++;
            x->x_onset = onset2;
            if (automatic)
            {
                clock_delay(x->x_clock,
                    x->x_clockdelay = ap->a_w.w_float * x->x_tempo);
                x->x_whenclockset = clock_getsystime();
            }
            else outlet_list(x->x_ob.ob_outlet, 0, onset2-onset, ap);
            x->x_innext = 0;
            return;
        }
        ap2 = ap + 1;
        onset2 = onset + 1;
        while (onset2 < argc &&
            (ap2->a_type == A_FLOAT || ap2->a_type == A_SYMBOL))
                onset2++, ap2++;
        x->x_onset = onset2;
        count = onset2 - onset;
        if (!target)
        {
            if (ap->a_type != A_SYMBOL) continue;
            else if (!(target = ap->a_w.w_symbol->s_thing))
            {
                pd_error(x, "qlist: %s: no such object",
                    ap->a_w.w_symbol->s_name);
                continue;
            }
            ap++;
            onset++;
            count--;
            if (!count)
            {
                x->x_onset = onset2;
                continue;
            }
        }
        wasrewound = x->x_rewound;
        x->x_rewound = 0;
        if (!drop)
        {
            if (ap->a_type == A_FLOAT)
                typedmess(target, &s_list, count, ap);
            else if (ap->a_type == A_SYMBOL)
                typedmess(target, ap->a_w.w_symbol, count-1, ap+1);
        }
        if (x->x_rewound)
        {
            x->x_innext = 0;
            return;
        }
        x->x_rewound = wasrewound;
    }  /* while (1); never falls through */

end:
    x->x_onset = 0x7fffffff;
    x->x_whenclockset = 0;
    x->x_innext = 0;
    outlet_bang(x->x_bangout);
}